

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

void __thiscall QHttp2Stream::maybeResumeUpload(QHttp2Stream *this)

{
  uint uVar1;
  long *plVar2;
  bool bVar3;
  QHttp2Connection *pQVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 local_50 [12];
  undefined8 uStack_44;
  undefined4 local_3c;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  qHttp2ConnectionLog();
  if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
      0) {
    local_50._0_4_ = 2;
    local_50._4_8_ = 0;
    uStack_44 = 0;
    local_3c = 0;
    local_38 = qHttp2ConnectionLog::category.name;
    pQVar4 = getConnection(this);
    uVar1 = *(uint *)(this + 0x10);
    plVar2 = *(long **)(this + 0x38);
    if (plVar2 == (long *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (**(code **)(*plVar2 + 0x88))(plVar2);
      lVar6 = (**(code **)(**(long **)(this + 0x38) + 0x78))();
      lVar5 = lVar5 - lVar6;
    }
    bVar3 = isUploadBlocked(this);
    QMessageLogger::debug
              (local_50,
               "[%p] stream %u, maybeResumeUpload. Upload device: %p, bytes available: %lld, blocked? %d"
               ,pQVar4,(ulong)uVar1,plVar2,lVar5,(uint)bVar3);
  }
  if (*(long *)(this + 0x38) != 0) {
    bVar3 = isUploadBlocked(this);
    if (!bVar3) {
      internalSendDATA(this);
      goto LAB_001d57dd;
    }
  }
  pQVar4 = getConnection(this);
  QSet<unsigned_int>::insert((QSet<unsigned_int> *)local_50,(uint *)&pQVar4->m_blockedStreams);
LAB_001d57dd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Stream::maybeResumeUpload()
{
    qCDebug(qHttp2ConnectionLog,
            "[%p] stream %u, maybeResumeUpload. Upload device: %p, bytes available: %lld, blocked? "
            "%d",
            getConnection(), m_streamID, m_uploadByteDevice,
            !m_uploadByteDevice ? 0 : m_uploadByteDevice->size() - m_uploadByteDevice->pos(),
            isUploadBlocked());
    if (isUploadingDATA() && !isUploadBlocked())
        internalSendDATA();
    else
        getConnection()->m_blockedStreams.insert(streamID());
}